

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::execNegRg<(moira::Instr)83,(moira::Mode)0,(moira::Size)4>(Moira *this,u16 opcode)

{
  u32 uVar1;
  
  uVar1 = logic<(moira::Instr)83,(moira::Size)4>
                    (this,*(u32 *)((long)this->exec + (ulong)(opcode & 7) * 4 + -0x58));
  prefetch<4ul>(this);
  (*this->_vptr_Moira[0x19])(this,2);
  *(u32 *)((long)this->exec + (ulong)(opcode & 7) * 4 + -0x58) = uVar1;
  return;
}

Assistant:

void
Moira::execNegRg(u16 opcode)
{
    int dst = ( _____________xxx(opcode) );
    u32 ea, data;

    if (!readOp<M,S>(dst, ea, data)) return;

    data = logic<I,S>(data);
    prefetch<POLLIPL>();

    if (S == Long) sync(2);
    writeD<S>(dst, data);
}